

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O1

int id_resize(nni_id_map *m)

{
  nni_id_entry *pnVar1;
  uint32_t uVar2;
  nni_id_entry *ptr;
  bool bVar3;
  nni_id_map **ppnVar4;
  uint uVar5;
  uint32_t uVar6;
  nni_id_map **__dest;
  nni_id_entry *pnVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  nni_id_entry *pnVar12;
  int iVar13;
  ulong uVar14;
  
  if ((m->id_load < m->id_max_load) && (m->id_min_load <= m->id_load)) {
    return 0;
  }
  iVar13 = 0;
  bVar3 = true;
  if ((m->id_flags & 5) == 1) {
    nni_mtx_lock(&id_reg_mtx);
    if (id_reg_len <= id_reg_num) {
      uVar11 = 10;
      if (9 < id_reg_len) {
        uVar11 = (ulong)(uint)(id_reg_len * 2);
      }
      __dest = (nni_id_map **)nni_zalloc(uVar11 * 8);
      if (__dest == (nni_id_map **)0x0) {
        nni_mtx_unlock(&id_reg_mtx);
        ppnVar4 = id_reg_map;
      }
      else {
        id_reg_len = (int)uVar11;
        ppnVar4 = __dest;
        if (id_reg_map != (nni_id_map **)0x0) {
          memcpy(__dest,id_reg_map,(long)id_reg_num << 3);
        }
      }
      id_reg_map = ppnVar4;
      if (__dest == (nni_id_map **)0x0) {
        iVar13 = 2;
        bVar3 = false;
        goto LAB_00112573;
      }
    }
    lVar9 = (long)id_reg_num;
    id_reg_num = id_reg_num + 1;
    id_reg_map[lVar9] = m;
    *(byte *)&m->id_flags = (byte)m->id_flags | 4;
    nni_mtx_unlock(&id_reg_mtx);
  }
LAB_00112573:
  if (bVar3) {
    uVar11 = (ulong)m->id_cap;
    uVar5 = 8;
    do {
      uVar8 = uVar5;
      uVar5 = uVar8 * 2;
    } while (uVar8 < m->id_count * 2);
    iVar13 = 0;
    if (uVar8 != m->id_cap) {
      ptr = m->id_entries;
      pnVar7 = (nni_id_entry *)nni_zalloc((ulong)uVar8 * 0x18);
      if (pnVar7 == (nni_id_entry *)0x0) {
        iVar13 = 2;
      }
      else {
        m->id_entries = pnVar7;
        m->id_cap = uVar8;
        m->id_load = 0;
        if (uVar8 < 9) {
          m->id_min_load = 0;
          uVar5 = 5;
        }
        else {
          m->id_min_load = uVar8 >> 3;
          uVar5 = (uVar8 * 2) / 3;
        }
        m->id_max_load = uVar5;
        iVar13 = 0;
        if (uVar11 != 0) {
          uVar14 = 0;
          do {
            if (ptr[uVar14].val != (void *)0x0) {
              pnVar1 = ptr + uVar14;
              uVar10 = (ulong)((uint)pnVar1->key & uVar8 - 1);
              uVar6 = m->id_load + 1;
              if (pnVar7[uVar10].val != (void *)0x0) {
                uVar2 = m->id_cap;
                do {
                  pnVar7[uVar10].skips = pnVar7[uVar10].skips + 1;
                  uVar10 = (ulong)((int)uVar10 * 5 + 1U & uVar2 - 1);
                  uVar6 = uVar6 + 1;
                } while (pnVar7[uVar10].val != (void *)0x0);
              }
              pnVar12 = pnVar7 + uVar10;
              m->id_load = uVar6;
              if (pnVar12->skips != 0) {
                nni_panic("%s: %d: assert err: %s",
                          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c"
                          ,0xdd,"new_entries[index].skips == 0");
              }
              pnVar12->val = pnVar1->val;
              pnVar12->key = pnVar1->key;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar11);
          nni_free(ptr,uVar11 * 0x18);
          iVar13 = 0;
        }
      }
    }
  }
  return iVar13;
}

Assistant:

static int
id_resize(nni_id_map *m)
{
	nni_id_entry *new_entries;
	nni_id_entry *old_entries;
	uint32_t      new_cap;
	uint32_t      old_cap;
	uint32_t      i;
	int           rv;

	if ((m->id_load < m->id_max_load) && (m->id_load >= m->id_min_load)) {
		// No resize needed.
		return (0);
	}

	// if it is a statically declared map, register it so that we
	// will free it at finalization time
	if ((rv = id_map_register(m)) != 0) {
		return (rv);
	}

	old_cap = m->id_cap;
	new_cap = 8;
	while (new_cap < (m->id_count * 2)) {
		new_cap *= 2;
	}
	if (new_cap == old_cap) {
		// Same size.
		return (0);
	}

	old_entries = m->id_entries;
	new_entries = NNI_ALLOC_STRUCTS(new_entries, new_cap);
	if (new_entries == NULL) {
		return (NNG_ENOMEM);
	}

	m->id_entries = new_entries;
	m->id_cap     = new_cap;
	m->id_load    = 0;
	if (new_cap > 8) {
		m->id_min_load = new_cap / 8;
		m->id_max_load = new_cap * 2 / 3;
	} else {
		m->id_min_load = 0;
		m->id_max_load = 5;
	}
	for (i = 0; i < old_cap; i++) {
		size_t index;
		if (old_entries[i].val == NULL) {
			continue;
		}
		index = old_entries[i].key & (new_cap - 1);
		for (;;) {
			// Increment the load unconditionally.  It counts
			// once for every item stored, plus once for each
			// hashing operation we use to store the item (i.e.
			// one for the item, plus once for each rehash.)
			m->id_load++;
			if (new_entries[index].val == NULL) {
				// As we are hitting this entry for the first
				// time, it won't have any skips.
				NNI_ASSERT(new_entries[index].skips == 0);
				new_entries[index].val = old_entries[i].val;
				new_entries[index].key = old_entries[i].key;
				break;
			}
			new_entries[index].skips++;
			index = ID_NEXT(m, index);
		}
	}
	if (old_cap != 0) {
		NNI_FREE_STRUCTS(old_entries, old_cap);
	}
	return (0);
}